

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  XML_Convert_Result XVar6;
  int iVar7;
  long lVar8;
  char **ppcVar9;
  uint uVar10;
  unsigned_short **ppuVar12;
  char **ppcVar13;
  char **ppcVar14;
  char **ppcVar15;
  char **ppcVar16;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char *extraout_RDX_04;
  char **extraout_RDX_05;
  char *extraout_RDX_06;
  char **extraout_RDX_07;
  char *extraout_RDX_08;
  char **extraout_RDX_09;
  char *extraout_RDX_10;
  char **extraout_RDX_11;
  char *extraout_RDX_12;
  char **extraout_RDX_13;
  char **extraout_RDX_14;
  char **extraout_RDX_15;
  char **extraout_RDX_16;
  char **extraout_RDX_17;
  char **extraout_RDX_18;
  char **extraout_RDX_19;
  int unaff_EBX;
  byte bVar17;
  char **local_50;
  char **local_48;
  char *local_40;
  char *local_38;
  uint uVar11;
  
  lVar8 = (long)end - (long)ptr;
  if (0 < lVar8) {
    local_38 = end + -1;
    local_40 = end + -2;
    bVar3 = false;
    ppcVar16 = (char **)end;
    local_50 = (char **)ptr;
    local_48 = nextTokPtr;
    do {
      ppcVar9 = local_50;
      uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_50);
      uVar10 = uVar11 - 5;
      if (0x18 < uVar10) {
switchD_0017e652_caseD_8:
        *nextTokPtr = (char *)local_50;
        return 0;
      }
      ppuVar12 = (unsigned_short **)
                 ((long)&switchD_0017e652::switchdataD_001acc10 +
                 (long)(int)(&switchD_0017e652::switchdataD_001acc10)[uVar10]);
      switch(uVar11) {
      case 5:
        if (lVar8 == 1) {
          return -2;
        }
        iVar7 = (*enc[3].literalScanners[0])
                          (enc,(char *)local_50,(char *)ppcVar16,(char **)ppuVar12);
        if ((iVar7 != 0) ||
           (XVar6 = (*enc[2].utf16Convert)
                              (enc,ppcVar9,extraout_RDX_04,ppuVar12,(unsigned_short *)nextTokPtr),
           XVar6 == XML_CONVERT_COMPLETED)) {
LAB_0017ed2b:
          *local_48 = (char *)ppcVar9;
          return 0;
        }
        local_50 = (char **)((long)ppcVar9 + 2);
        ppcVar16 = extraout_RDX_05;
        nextTokPtr = local_48;
        break;
      case 6:
        if (lVar8 < 3) {
          return -2;
        }
        iVar7 = (*enc[3].literalScanners[1])
                          (enc,(char *)local_50,(char *)ppcVar16,(char **)ppuVar12);
        if ((iVar7 != 0) || (iVar7 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar9), iVar7 == 0))
        goto LAB_0017ed2b;
        local_50 = (char **)((long)ppcVar9 + 3);
        ppcVar16 = extraout_RDX_03;
        nextTokPtr = local_48;
        break;
      case 7:
        if (lVar8 < 4) {
          return -2;
        }
        iVar7 = (*enc[3].nameMatchesAscii)(enc,(char *)local_50,(char *)ppcVar16,(char *)ppuVar12);
        if ((iVar7 != 0) ||
           (iVar7 = (*enc[3].scanners[0])(enc,(char *)ppcVar9,extraout_RDX_06,(char **)ppuVar12),
           iVar7 == 0)) goto LAB_0017ed2b;
        local_50 = (char **)((long)ppcVar9 + 4);
        ppcVar16 = extraout_RDX_07;
        nextTokPtr = local_48;
        break;
      default:
        goto switchD_0017e652_caseD_8;
      case 9:
      case 10:
      case 0x15:
        lVar8 = (long)local_38 - (long)local_50;
        do {
          local_50 = (char **)((long)local_50 + 1);
          iVar7 = 1;
          if (lVar8 < 1) {
            unaff_EBX = -1;
          }
          else {
            bVar17 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_50);
            if (bVar17 - 9 < 2) {
LAB_0017e699:
              iVar7 = 0;
            }
            else if (bVar17 == 0xe) {
              iVar7 = 6;
            }
            else {
              if (bVar17 == 0x15) goto LAB_0017e699;
              *nextTokPtr = (char *)local_50;
              unaff_EBX = 0;
            }
          }
          lVar8 = lVar8 + -1;
        } while (iVar7 == 0);
        if (iVar7 != 6) {
          return unaff_EBX;
        }
      case 0xe:
        ppcVar9 = (char **)((long)local_50 + 1);
        ppcVar16 = local_50;
        if ((long)end - (long)ppcVar9 < 1) {
LAB_0017ea5c:
          iVar7 = -1;
LAB_0017ea66:
          unaff_EBX = iVar7;
          local_50 = ppcVar9;
          bVar4 = false;
        }
        else {
          bVar17 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)((long)local_50 + 1));
          if ((bVar17 & 0xfe) != 0xc) {
            lVar8 = (long)local_40 - (long)local_50;
            do {
              local_50 = ppcVar9;
              if ((0x15 < bVar17) ||
                 (ppcVar16 = (char **)(ulong)bVar17, (0x200600U >> (bVar17 & 0x1f) & 1) == 0)) {
                *nextTokPtr = (char *)local_50;
                goto LAB_0017ebf6;
              }
              ppcVar9 = (char **)end;
              if (lVar8 < 1) goto LAB_0017ea5c;
              bVar17 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)((long)local_50 + 1));
              ppcVar16 = (char **)((ulong)bVar17 & 0xfffffffffffffffe);
              lVar8 = lVar8 + -1;
              ppcVar9 = (char **)((long)local_50 + 1);
            } while ((char)ppcVar16 != '\f');
          }
          ppcVar16 = (char **)((long)local_50 + 2);
          local_50 = ppcVar16;
          do {
            ppcVar9 = local_50;
            lVar8 = (long)end - (long)local_50;
            iVar7 = 1;
            if (lVar8 < 1) {
              unaff_EBX = -1;
              goto LAB_0017e879;
            }
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_50);
            ppcVar16 = (char **)(ulong)bVar2;
            if (bVar2 == bVar17) {
              iVar7 = 0xc;
              goto LAB_0017e879;
            }
            uVar10 = (uint)bVar2;
            if (8 < uVar10) {
switchD_0017e7a1_caseD_4:
              local_50 = (char **)((long)local_50 + 1);
              iVar7 = 0;
              goto LAB_0017e879;
            }
            ppcVar16 = (char **)((long)&switchD_0017e7a1::switchdataD_001acc74 +
                                (long)(int)(&switchD_0017e7a1::switchdataD_001acc74)[uVar10]);
            switch(uVar10) {
            default:
              *nextTokPtr = (char *)local_50;
              unaff_EBX = 0;
              break;
            case 3:
              iVar5 = normal_scanRef(enc,(char *)((long)local_50 + 1),end,(char **)&local_50);
              iVar7 = 0;
              ppcVar16 = extraout_RDX_01;
              nextTokPtr = local_48;
              if (iVar5 < 1) {
                if (iVar5 == 0) {
                  *local_48 = (char *)local_50;
                }
                iVar7 = 1;
                unaff_EBX = iVar5;
              }
              break;
            case 4:
              goto switchD_0017e7a1_caseD_4;
            case 5:
              if (lVar8 == 1) {
LAB_0017e7f4:
                unaff_EBX = -2;
              }
              else {
                iVar7 = (*enc[3].literalScanners[0])
                                  (enc,(char *)local_50,(char *)ppcVar16,(char **)0x1);
                ppcVar16 = extraout_RDX;
                if (iVar7 == 0) {
                  local_50 = (char **)((long)ppcVar9 + 2);
                  goto LAB_0017e867;
                }
LAB_0017e852:
                *local_48 = (char *)ppcVar9;
                unaff_EBX = 0;
                iVar7 = 1;
                nextTokPtr = local_48;
              }
              break;
            case 6:
              if (lVar8 < 3) goto LAB_0017e7f4;
              iVar7 = (*enc[3].literalScanners[1])
                                (enc,(char *)local_50,(char *)ppcVar16,(char **)0x1);
              ppcVar16 = extraout_RDX_00;
              if (iVar7 != 0) goto LAB_0017e852;
              local_50 = (char **)((long)ppcVar9 + 3);
              goto LAB_0017e867;
            case 7:
              if (lVar8 < 4) goto LAB_0017e7f4;
              iVar7 = (*enc[3].nameMatchesAscii)(enc,(char *)local_50,(char *)ppcVar16,(char *)0x1);
              ppcVar16 = extraout_RDX_02;
              if (iVar7 != 0) goto LAB_0017e852;
              local_50 = (char **)((long)ppcVar9 + 4);
LAB_0017e867:
              iVar7 = 0;
              nextTokPtr = local_48;
            }
LAB_0017e879:
          } while (iVar7 == 0);
          if (iVar7 == 0xc) {
            ppcVar13 = (char **)((long)local_50 + 1);
            ppcVar16 = (char **)(end + -(long)ppcVar13);
            iVar7 = -1;
            ppcVar9 = ppcVar13;
            if (0 < (long)ppcVar16) {
              bVar17 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
              ppcVar16 = (char **)(ulong)bVar17;
              if (bVar17 < 0x11) {
                if (bVar17 - 9 < 2) {
LAB_0017eb1c:
                  ppcVar16 = (char **)(end + -((long)local_50 + 2));
                  ppcVar9 = (char **)((long)local_50 + 2);
                  if (0 < (long)ppcVar16) {
                    ppcVar16 = (char **)(end + -(long)ppcVar13);
                    lVar8 = 1;
                    ppcVar14 = (char **)0x0;
LAB_0017eb3d:
                    switch(*(undefined1 *)
                            ((long)enc[1].scanners + (ulong)*(byte *)((long)ppcVar13 + lVar8))) {
                    case 5:
                      ppcVar9 = (char **)((long)ppcVar13 + (1 - (long)ppcVar14));
                      ppcVar16 = (char **)((long)ppcVar16 + (long)ppcVar14);
                      local_50 = ppcVar9;
                      if (ppcVar16 != (char **)0x2) {
                        ppcVar15 = ppcVar14;
                        iVar7 = (*enc[3].literalScanners[0])
                                          (enc,(char *)ppcVar9,(char *)ppcVar16,ppcVar14);
                        ppcVar16 = extraout_RDX_18;
                        if ((iVar7 == 0) &&
                           (iVar7 = (*enc[3].scanners[1])
                                              (enc,(char *)ppcVar9,(char *)extraout_RDX_18,ppcVar15)
                           , ppcVar16 = extraout_RDX_19, iVar7 != 0)) {
                          local_50 = (char **)((long)ppcVar13 + (3 - (long)ppcVar14));
LAB_0017ecf5:
                          bVar4 = true;
                          nextTokPtr = local_48;
                        }
                        else {
LAB_0017ecc6:
                          *local_48 = (char *)ppcVar9;
                          bVar4 = false;
                          unaff_EBX = 0;
                          nextTokPtr = local_48;
                        }
                        goto LAB_0017ea68;
                      }
                      break;
                    case 6:
                      ppcVar9 = (char **)((long)ppcVar13 + (1 - (long)ppcVar14));
                      local_50 = ppcVar9;
                      if ((byte *)0x2 < (byte *)((long)ppcVar16 + (long)ppcVar14) + -1) {
                        ppcVar15 = ppcVar14;
                        iVar7 = (*enc[3].literalScanners[1])
                                          (enc,(char *)ppcVar9,(char *)ppcVar16,ppcVar14);
                        ppcVar16 = extraout_RDX_16;
                        if ((iVar7 != 0) ||
                           (iVar7 = (*enc[3].scanners[2])
                                              (enc,(char *)ppcVar9,(char *)extraout_RDX_16,ppcVar15)
                           , ppcVar16 = extraout_RDX_17, iVar7 == 0)) goto LAB_0017ecc6;
                        local_50 = (char **)((long)ppcVar13 + (4 - (long)ppcVar14));
                        goto LAB_0017ecf5;
                      }
                      break;
                    case 7:
                      ppcVar9 = (char **)((long)ppcVar13 + (1 - (long)ppcVar14));
                      local_50 = ppcVar9;
                      if ((byte *)0x3 < (byte *)((long)ppcVar16 + (long)ppcVar14) + -1) {
                        ppcVar15 = ppcVar14;
                        iVar7 = (*enc[3].nameMatchesAscii)
                                          (enc,(char *)ppcVar9,(char *)ppcVar16,(char *)ppcVar14);
                        ppcVar16 = extraout_RDX_14;
                        if ((iVar7 != 0) ||
                           (iVar7 = (*enc[3].scanners[3])
                                              (enc,(char *)ppcVar9,(char *)extraout_RDX_14,ppcVar15)
                           , ppcVar16 = extraout_RDX_15, iVar7 == 0)) goto LAB_0017ecc6;
                        local_50 = (char **)((long)ppcVar13 + (5 - (long)ppcVar14));
                        goto LAB_0017ecf5;
                      }
                      break;
                    default:
                      local_50 = (char **)((long)ppcVar13 + (1 - (long)ppcVar14));
                      *nextTokPtr = (char *)local_50;
                      goto LAB_0017ebf6;
                    case 9:
                    case 10:
                    case 0x15:
                      goto switchD_0017eb61_caseD_9;
                    case 0xb:
                      local_50 = (char **)((long)ppcVar13 + (1 - (long)ppcVar14));
                      goto LAB_0017e8d5;
                    case 0x11:
                      ppcVar13 = (char **)((long)ppcVar13 + (1 - (long)ppcVar14));
                      goto LAB_0017ebc0;
                    case 0x16:
                    case 0x18:
                      local_50 = (char **)((long)ppcVar13 + (2 - (long)ppcVar14));
                      bVar4 = true;
                      goto LAB_0017ea68;
                    }
                    bVar4 = false;
                    unaff_EBX = -2;
                    goto LAB_0017ea68;
                  }
                }
                else {
                  local_50 = ppcVar13;
                  if (bVar17 != 0xb) {
LAB_0017eb8d:
                    *nextTokPtr = (char *)ppcVar13;
                    local_50 = ppcVar13;
LAB_0017ebf6:
                    bVar4 = false;
                    unaff_EBX = 0;
                    goto LAB_0017ea68;
                  }
LAB_0017e8d5:
                  *nextTokPtr = (char *)((long)local_50 + 1);
                  ppcVar9 = local_50;
                  iVar7 = 1;
                }
              }
              else {
                if (bVar17 != 0x11) {
                  if (bVar17 != 0x15) goto LAB_0017eb8d;
                  goto LAB_0017eb1c;
                }
LAB_0017ebc0:
                local_50 = ppcVar13;
                ppcVar16 = (char **)((long)local_50 + 1);
                ppcVar9 = ppcVar16;
                if ((char **)end != ppcVar16 && -1 < (long)end - (long)ppcVar16) {
                  if (*(byte *)ppcVar16 != 0x3e) {
                    *nextTokPtr = (char *)ppcVar16;
                    local_50 = ppcVar16;
                    goto LAB_0017ebf6;
                  }
                  *nextTokPtr = (char *)((long)local_50 + 2);
                  iVar7 = 3;
                }
              }
            }
            goto LAB_0017ea66;
          }
          bVar4 = false;
        }
LAB_0017ea68:
        bVar3 = false;
        if (!bVar4) {
          return unaff_EBX;
        }
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        local_50 = (char **)((long)local_50 + 1);
        break;
      case 0x17:
        if (bVar3) goto switchD_0017e652_caseD_8;
        ppcVar13 = (char **)((long)local_50 + 1);
        lVar8 = (long)end - (long)ppcVar13;
        if (lVar8 < 1) {
          return -1;
        }
        bVar17 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
        ppcVar14 = (char **)(ulong)bVar17;
        if (bVar17 < 0x16) {
          local_50 = ppcVar13;
          if (bVar17 == 5) {
            if (lVar8 == 1) {
              return -2;
            }
            iVar7 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar13,(char *)ppcVar16,ppcVar14);
            if ((iVar7 != 0) ||
               (iVar7 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,extraout_RDX_10,ppcVar14),
               iVar7 == 0)) {
LAB_0017ed41:
              *local_48 = (char *)ppcVar13;
              return 0;
            }
            local_50 = (char **)((long)ppcVar9 + 3);
            ppcVar16 = extraout_RDX_11;
          }
          else if (bVar17 == 6) {
            if (lVar8 < 3) {
              return -2;
            }
            iVar7 = (*enc[3].literalScanners[1])(enc,(char *)ppcVar13,(char *)ppcVar16,ppcVar14);
            if ((iVar7 != 0) ||
               (iVar7 = (*enc[3].scanners[2])(enc,(char *)ppcVar13,extraout_RDX_12,ppcVar14),
               iVar7 == 0)) goto LAB_0017ed41;
            local_50 = (char **)((long)ppcVar9 + 4);
            ppcVar16 = extraout_RDX_13;
          }
          else {
            if (bVar17 != 7) goto LAB_0017ed4e;
            if (lVar8 < 4) {
              return -2;
            }
            iVar7 = (*enc[3].nameMatchesAscii)
                              (enc,(char *)ppcVar13,(char *)ppcVar16,(char *)ppcVar14);
            if ((iVar7 != 0) ||
               (iVar7 = (*enc[3].scanners[3])(enc,(char *)ppcVar13,extraout_RDX_08,ppcVar14),
               iVar7 == 0)) goto LAB_0017ed41;
            local_50 = (char **)((long)ppcVar9 + 5);
            ppcVar16 = extraout_RDX_09;
          }
          bVar3 = true;
          nextTokPtr = local_48;
        }
        else {
          if ((bVar17 != 0x16) && (bVar17 != 0x18)) {
LAB_0017ed4e:
            *nextTokPtr = (char *)ppcVar13;
            return 0;
          }
          local_50 = (char **)((long)local_50 + 2);
          bVar3 = true;
        }
      }
      lVar8 = (long)end - (long)local_50;
    } while (0 < lVar8);
  }
  return -1;
switchD_0017eb61_caseD_9:
  pbVar1 = (byte *)((long)ppcVar16 + (long)ppcVar14);
  ppcVar14 = (char **)((long)ppcVar14 + -1);
  lVar8 = lVar8 + 1;
  ppcVar9 = (char **)end;
  if (pbVar1 == (byte *)0x2 || (long)(pbVar1 + -2) < 0) goto LAB_0017ea66;
  goto LAB_0017eb3d;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
#  ifdef XML_NS
  int hadColon = 0;
#  endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#  ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#  endif
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS: {
      int open;
#  ifdef XML_NS
      hadColon = 0;
#  endif
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        open = BYTE_TYPE(enc, ptr);
        if (open == BT_QUOT || open == BT_APOS)
          break;
        switch (open) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      ptr += MINBPC(enc);
      /* in attribute value */
      for (;;) {
        int t;
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == open)
          break;
        switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_AMP: {
          int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
          if (tok <= 0) {
            if (tok == XML_TOK_INVALID)
              *nextTokPtr = ptr;
            return tok;
          }
          break;
        }
        case BT_LT:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
        break;
      case BT_SOL:
        goto sol;
      case BT_GT:
        goto gt;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* ptr points to closing quote */
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
        case BT_S:
        case BT_CR:
        case BT_LF:
          continue;
        case BT_GT:
        gt:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_START_TAG_WITH_ATTS;
        case BT_SOL:
        sol:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        break;
      }
      break;
    }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}